

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcaf_grammar_id(mpc_val_t *x,void *s)

{
  mpc_parser_t *pmVar1;
  
  pmVar1 = mpca_grammar_find_parser((char *)x,(mpca_grammar_st_t *)s);
  free(x);
  if (pmVar1->name != (char *)0x0) {
    pmVar1 = mpca_add_tag(pmVar1,pmVar1->name);
  }
  pmVar1 = mpca_root(pmVar1);
  pmVar1 = mpca_state(pmVar1);
  return pmVar1;
}

Assistant:

static mpc_val_t *mpcaf_grammar_id(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpc_parser_t *p = mpca_grammar_find_parser(x, st);
  free(x);

  if (p->name) {
    return mpca_state(mpca_root(mpca_add_tag(p, p->name)));
  } else {
    return mpca_state(mpca_root(p));
  }
}